

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurl.cpp
# Opt level: O0

void TPZShapeHCurl<pzshape::TPZShapeQuad>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZShapeData *data)

{
  int iVar1;
  int64_t iVar2;
  int *piVar3;
  long in_RDX;
  TPZVec<int> *in_RSI;
  TPZVec<int> *in_stack_00000020;
  TPZFNMatrix<9,_double> gradX;
  int i;
  int nShape;
  int trans_id;
  int pos;
  int iside;
  int NSides;
  int NCorners;
  int ncon;
  size_t in_stack_00000238;
  char *in_stack_00000240;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  TPZVec<long> *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe30;
  TPZManVector<int,_27> *in_stack_fffffffffffffe38;
  TPZManVector<int,_27> *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  int in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  TPZVec<int> *in_stack_fffffffffffffe58;
  TPZFNMatrix<9,_double> *in_stack_fffffffffffffe60;
  int64_t in_stack_fffffffffffffe88;
  TPZManVector<std::pair<int,_long>,_60> *in_stack_fffffffffffffe90;
  undefined4 local_dc;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  TPZVec<int> *in_stack_ffffffffffffff30;
  TPZShapeData *in_stack_ffffffffffffff40;
  TPZVec<int> *in_stack_ffffffffffffff48;
  TPZVec<long> *in_stack_ffffffffffffff50;
  TPZShapeData *in_stack_ffffffffffffffa0;
  undefined4 local_2c;
  
  iVar2 = TPZVec<int>::size(in_RSI);
  if (iVar2 != 5) {
    pzinternal::DebugStopImpl(in_stack_00000240,in_stack_00000238);
  }
  CalcH1ShapeOrders(in_stack_ffffffffffffff30,
                    (TPZVec<int> *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  TPZShapeH1<pzshape::TPZShapeQuad>::Initialize
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  TPZManVector<int,_20>::Resize
            ((TPZManVector<int,_20> *)in_stack_fffffffffffffe60,(int64_t)in_stack_fffffffffffffe58,
             (int *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  for (local_2c = 4; local_2c < 9; local_2c = local_2c + 1) {
    iVar1 = pztopology::TPZQuadrilateral::GetTransformId
                      (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDX + 0x2230),(long)(local_2c + -4));
    *piVar3 = iVar1;
  }
  TPZManVector<int,_27>::TPZManVector
            ((TPZManVector<int,_27> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  TPZManVector<int,_27>::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  TPZManVector<int,_27>::~TPZManVector
            ((TPZManVector<int,_27> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20))
  ;
  TPZManVector<int,_27>::Resize
            ((TPZManVector<int,_27> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  for (local_dc = 0; local_dc < 5; local_dc = local_dc + 1) {
    TPZVec<int>::operator[](in_RSI,(long)local_dc);
    iVar1 = ComputeNConnectShapeF(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
    piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDX + 0x2be0),(long)local_dc);
    *piVar3 = iVar1;
    TPZVec<int>::operator[]((TPZVec<int> *)(in_RDX + 0x2be0),(long)local_dc);
  }
  TPZManVector<std::pair<int,_long>,_60>::Resize
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  iVar2 = 0;
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffffe60,(int64_t)in_stack_fffffffffffffe58,
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             (double *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  TPZMatrix<double>::Identity
            ((TPZMatrix<double> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  TPZFMatrix<double>::Redim
            ((TPZFMatrix<double> *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
             (int64_t)in_stack_fffffffffffffe40,iVar2);
  pztopology::TPZQuadrilateral::ComputeHCurlDirections<double>
            ((TPZFMatrix<double> *)
             gradX.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow,
             (TPZFMatrix<double> *)
             gradX.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
             super_TPZSavable._vptr_TPZSavable,in_stack_00000020);
  ComputeVecandShape(in_stack_ffffffffffffffa0);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x18c1141);
  return;
}

Assistant:

void TPZShapeHCurl<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                       TPZVec<int> &connectorders,
                                       TPZShapeData &data)
{
    
        
    constexpr int ncon = TSHAPE::NSides-TSHAPE::NCornerNodes;
    constexpr int NCorners = TSHAPE::NCornerNodes;
    constexpr int NSides = TSHAPE::NSides;
    if(connectorders.size() != ncon) DebugStop();
    CalcH1ShapeOrders(connectorders, data.fH1ConnectOrders);
    TPZShapeH1<TSHAPE>::Initialize(ids, data.fH1ConnectOrders, data);
    data.fSideTransformationId.Resize(NSides-NCorners, 0);
    for (int iside = NCorners; iside< NSides ; iside++) {
        int pos = iside - NCorners;
        int trans_id = TSHAPE::GetTransformId(iside, ids); // Foi criado
        data.fSideTransformationId[iside-NCorners] = trans_id;
    }

    data.fHDivConnectOrders = connectorders;

    data.fHDivNumConnectShape.Resize(ncon);
    int nShape = 0;
    for (int i = 0; i < ncon; i++)
    {
        data.fHDivNumConnectShape[i] = ComputeNConnectShapeF(i,connectorders[i]);
        nShape += data.fHDivNumConnectShape[i];
    }
    
    data.fSDVecShapeIndex.Resize(nShape);
    TPZFNMatrix<9,REAL> gradX(TSHAPE::Dimension, TSHAPE::Dimension, 0);
    gradX.Identity();

    data.fMasterDirections.Redim(TSHAPE::Dimension, 3*NSides);
    TSHAPE::ComputeHCurlDirections(gradX,data.fMasterDirections,data.fSideTransformationId);

    ComputeVecandShape(data);
}